

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

string * Capitalize(string *__return_storage_ptr__,string str)

{
  size_type *psVar1;
  char cVar2;
  long lVar3;
  undefined8 uVar4;
  size_type sVar5;
  char cVar6;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[1] == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = in_RSI + 2;
    if ((size_type *)*in_RSI == psVar1) {
      uVar4 = in_RSI[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*in_RSI;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    sVar5 = 0;
  }
  else {
    cVar2 = *(char *)*in_RSI;
    cVar6 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar6 = cVar2;
    }
    *(char *)*in_RSI = cVar6;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = in_RSI + 2;
    if ((size_type *)*in_RSI == psVar1) {
      uVar4 = in_RSI[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*in_RSI;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    sVar5 = in_RSI[1];
  }
  __return_storage_ptr__->_M_string_length = sVar5;
  *in_RSI = in_RSI + 2;
  in_RSI[1] = 0;
  *(undefined1 *)(in_RSI + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Capitalize(std::string str)
{
    if (str.empty()) return str;
    str[0] = ToUpper(str.front());
    return str;
}